

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::Bound_Function::build_param_type_info
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,Const_Proxy_Function *t_f,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_args)

{
  initializer_list<chaiscript::Type_Info> __l;
  ulong uVar1;
  int iVar2;
  element_type *peVar3;
  size_type sVar4;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *__x;
  size_type sVar5;
  const_reference pvVar6;
  const_reference this;
  Type_Info *this_00;
  bool bVar7;
  Type_Info local_a0;
  ulong local_88;
  size_t i;
  allocator<chaiscript::Type_Info> local_69;
  Type_Info local_68;
  iterator local_50;
  size_type local_48;
  undefined1 local_39;
  undefined1 local_38 [8];
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> types;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_args_local;
  Const_Proxy_Function *t_f_local;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *retval;
  
  types.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)t_args;
  peVar3 = std::
           __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)t_f);
  iVar2 = Proxy_Function_Base::get_arity(peVar3);
  bVar7 = true;
  if (-1 < iVar2) {
    peVar3 = std::
             __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)t_f);
    iVar2 = Proxy_Function_Base::get_arity(peVar3);
    sVar4 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::size
                      ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                       types.
                       super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar7 = iVar2 == (int)sVar4;
  }
  if (!bVar7) {
    __assert_fail("t_f->get_arity() < 0 || t_f->get_arity() == static_cast<int>(t_args.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/../dispatchkit/proxy_functions.hpp"
                  ,0x1e3,
                  "static std::vector<Type_Info> chaiscript::dispatch::Bound_Function::build_param_type_info(const Const_Proxy_Function &, const std::vector<Boxed_Value> &)"
                 );
  }
  peVar3 = std::
           __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)t_f);
  iVar2 = Proxy_Function_Base::get_arity(peVar3);
  if (iVar2 < 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              (__return_storage_ptr__);
  }
  else {
    peVar3 = std::
             __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)t_f);
    __x = Proxy_Function_Base::get_param_types(peVar3);
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_38,__x
              );
    sVar4 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                      ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                       local_38);
    sVar5 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::size
                      ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                       types.
                       super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar4 != sVar5 + 1) {
      __assert_fail("types.size() == t_args.size() + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/../dispatchkit/proxy_functions.hpp"
                    ,0x1ea,
                    "static std::vector<Type_Info> chaiscript::dispatch::Bound_Function::build_param_type_info(const Const_Proxy_Function &, const std::vector<Boxed_Value> &)"
                   );
    }
    local_39 = 0;
    pvVar6 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::operator[]
                       ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                        local_38,0);
    local_68.m_flags = pvVar6->m_flags;
    local_68.m_type_info = pvVar6->m_type_info;
    local_68.m_bare_type_info = pvVar6->m_bare_type_info;
    local_50 = &local_68;
    local_48 = 1;
    std::allocator<chaiscript::Type_Info>::allocator(&local_69);
    __l._M_len = local_48;
    __l._M_array = local_50;
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              (__return_storage_ptr__,__l,&local_69);
    std::allocator<chaiscript::Type_Info>::~allocator(&local_69);
    for (local_88 = 0; uVar1 = local_88,
        sVar4 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                          ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                           local_38), uVar1 < sVar4 - 1; local_88 = local_88 + 1) {
      this = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
             operator[]((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *
                        )types.
                         super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,local_88);
      this_00 = Boxed_Value::get_type_info(this);
      chaiscript::detail::Get_Type_Info<chaiscript::dispatch::Placeholder_Object>::get();
      bVar7 = Type_Info::operator==(this_00,&local_a0);
      if (bVar7) {
        pvVar6 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                 operator[]((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
                            )local_38,local_88 + 1);
        std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::push_back
                  (__return_storage_ptr__,pvVar6);
      }
    }
    local_39 = 1;
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
              ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Type_Info> build_param_type_info(const Const_Proxy_Function &t_f, const std::vector<Boxed_Value> &t_args) {
        assert(t_f->get_arity() < 0 || t_f->get_arity() == static_cast<int>(t_args.size()));

        if (t_f->get_arity() < 0) {
          return std::vector<Type_Info>();
        }

        const auto types = t_f->get_param_types();
        assert(types.size() == t_args.size() + 1);

        // this analysis warning is invalid in MSVC12 and doesn't exist in MSVC14
        std::vector<Type_Info> retval{types[0]};

        for (size_t i = 0; i < types.size() - 1; ++i) {
          if (t_args[i].get_type_info() == chaiscript::detail::Get_Type_Info<Placeholder_Object>::get()) {
            retval.push_back(types[i + 1]);
          }
        }

        return retval;
      }